

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<float>_>::Write
          (TPZSkylMatrix<std::complex<float>_> *this,TPZStream *buf,int withclassid)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  long lVar3;
  bool bVar4;
  int64_t nel;
  TPZVec<long> skyl;
  long local_38;
  TPZVec<long> local_30;
  
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZStream::Write<std::complex<float>>(buf,&this->fStorage);
  local_38 = 0;
  TPZVec<long>::TPZVec
            (&local_30,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + 1,
             &local_38);
  pcVar2 = (complex<float> *)(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  bVar4 = -1 < (long)pcVar2;
  if (pcVar2 != (complex<float> *)0x0) {
    pcVar2 = (this->fStorage).fStore;
  }
  if (bVar4) {
    ppcVar1 = (this->fElem).fStore;
    lVar3 = -1;
    do {
      local_30.fStore[lVar3 + 1] = (long)ppcVar1[lVar3 + 1] - (long)pcVar2 >> 3;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow);
  }
  local_38 = CONCAT44(local_30.fNElements._4_4_,(uint)local_30.fNElements);
  (*buf->_vptr_TPZStream[5])(buf,&local_38,1);
  if (local_38 != 0) {
    (*buf->_vptr_TPZStream[5])(buf,local_30.fStore,(ulong)(uint)local_30.fNElements);
  }
  local_30._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_30.fStore != (long *)0x0) {
    operator_delete__(local_30.fStore);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const
{
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    for (int64_t i=0; i<this->Rows()+1; i++) {
        skyl[i] = fElem[i] - ptr;
    }
    buf.Write( skyl);
}